

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplex.h
# Opt level: O2

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
          (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
           *this,Vertex_handle args,Vertex_handle args_1)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->simplex_set)._M_t._M_impl.super__Rb_tree_header;
  (this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  add_vertices<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            (this,args,args_1);
  return;
}

Assistant:

explicit Skeleton_blocker_simplex(Args ... args) {
    add_vertices(args...);
  }